

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

bool minihttp::_SetNonBlocking(SOCKET s,bool nonblock)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  if (s == -1) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    uVar1 = fcntl((int)s,3);
    if (-1 < (int)uVar1) {
      uVar3 = 0xfffff7ff;
      if (nonblock) {
        uVar3 = 0x800;
      }
      iVar2 = fcntl((int)s,4,(ulong)(uVar1 | uVar3));
      bVar4 = -1 < iVar2;
    }
  }
  return bVar4;
}

Assistant:

static bool _SetNonBlocking(SOCKET s, bool nonblock)
{
    if(!SOCKETVALID(s))
        return false;
#ifdef MINIHTTP_USE_MBEDTLS
    if(nonblock)
        return mbedtls_net_set_nonblock((mbedtls_net_context*)&s) == 0; // this horrible hackery is okay as long as the compile assert in HasSSL() holds
    else
        return mbedtls_net_set_block((mbedtls_net_context*)&s) == 0;
#elif defined(_WIN32)
    ULONG tmp = !!nonblock;
    if(::ioctlsocket(s, FIONBIO, &tmp) == SOCKET_ERROR)
        return false;
#else
    int tmp = ::fcntl(s, F_GETFL);
    if(tmp < 0)
        return false;
    if(::fcntl(s, F_SETFL, nonblock ? (tmp|O_NONBLOCK) : (tmp|=~O_NONBLOCK)) < 0)
        return false;
#endif
    return true;
}